

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

int Cut_CutFilterOne(Cut_Man_t *p,Cut_List_t *pSuperList,Cut_Cut_t *pCut)

{
  uint uVar1;
  int iVar2;
  Cut_Cut_t *pCVar3;
  Cut_Cut_t *pCVar4;
  ulong uVar5;
  Cut_Cut_t **ppCVar6;
  Cut_Cut_t **ppCVar7;
  Cut_Cut_t *pCVar8;
  ulong uVar9;
  
  uVar1 = *(uint *)pCut;
  uVar9 = 2;
  do {
    uVar5 = (ulong)(uVar1 >> 0x1c);
    if (uVar1 >> 0x1c < uVar9) {
      while( true ) {
        if (((byte)pCut->field_0x3 & 0xf) <= uVar5) {
          return 0;
        }
        pCVar8 = pSuperList->pHead[uVar5 + 1];
        if (pCVar8 == (Cut_Cut_t *)0x0) {
          pCVar3 = (Cut_Cut_t *)0x0;
        }
        else {
          pCVar3 = pCVar8->pNext;
        }
        ppCVar6 = pSuperList->pHead + uVar5 + 1;
        ppCVar7 = ppCVar6;
        while (pCVar4 = pCVar3, pCVar8 != (Cut_Cut_t *)0x0) {
          if (((pCut->uSign & ~pCVar8->uSign) == 0) &&
             (iVar2 = Cut_CutCheckDominance(pCut,pCVar8), iVar2 != 0)) {
            p->nCutsFilter = p->nCutsFilter + 1;
            p->nNodeCuts = p->nNodeCuts + -1;
            if (*ppCVar6 == pCVar8) {
              *ppCVar6 = pCVar8->pNext;
            }
            if (pSuperList->ppTail[uVar5 + 1] == &pCVar8->pNext) {
              pSuperList->ppTail[uVar5 + 1] = ppCVar7;
            }
            *ppCVar7 = pCVar8->pNext;
            Cut_CutRecycle(p,pCVar8);
          }
          else {
            ppCVar7 = &pCVar8->pNext;
          }
          pCVar3 = (Cut_Cut_t *)0x0;
          pCVar8 = pCVar4;
          if (pCVar4 != (Cut_Cut_t *)0x0) {
            pCVar3 = pCVar4->pNext;
          }
        }
        if (ppCVar7 != pSuperList->ppTail[uVar5 + 1]) break;
        uVar5 = uVar5 + 1;
        if (*ppCVar7 != (Cut_Cut_t *)0x0) {
          __assert_fail("*ppTail == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                        ,0xcf,"int Cut_CutFilterOne(Cut_Man_t *, Cut_List_t *, Cut_Cut_t *)");
        }
      }
      __assert_fail("ppTail == pSuperList->ppTail[a]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                    ,0xce,"int Cut_CutFilterOne(Cut_Man_t *, Cut_List_t *, Cut_Cut_t *)");
    }
    ppCVar6 = pSuperList->pHead + uVar9;
    while (pCVar8 = *ppCVar6, pCVar8 != (Cut_Cut_t *)0x0) {
      if (((pCVar8->uSign & ~pCut->uSign) == 0) &&
         (iVar2 = Cut_CutCheckDominance(pCVar8,pCut), iVar2 != 0)) {
        p->nCutsFilter = p->nCutsFilter + 1;
        Cut_CutRecycle(p,pCut);
        return 1;
      }
      ppCVar6 = &pCVar8->pNext;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static inline int Cut_CutFilterOne( Cut_Man_t * p, Cut_List_t * pSuperList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pTemp, * pTemp2, ** ppTail;
    int a;

    // check if this cut is filtered out by smaller cuts
    for ( a = 2; a <= (int)pCut->nLeaves; a++ )
    {
        Cut_ListForEachCut( pSuperList->pHead[a], pTemp )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Cut_CutCheckDominance( pTemp, pCut ) )
            {
                p->nCutsFilter++;
                Cut_CutRecycle( p, pCut );
                return 1;
            }
        }
    }

    // filter out other cuts using this one
    for ( a = pCut->nLeaves + 1; a <= (int)pCut->nVarsMax; a++ )
    {
        ppTail = pSuperList->pHead + a;
        Cut_ListForEachCutSafe( pSuperList->pHead[a], pTemp, pTemp2 )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
            {
                ppTail = &pTemp->pNext;
                continue;
            }
            // check containment seriously
            if ( Cut_CutCheckDominance( pCut, pTemp ) )
            {
                p->nCutsFilter++;
                p->nNodeCuts--;
                // move the head
                if ( pSuperList->pHead[a] == pTemp )
                    pSuperList->pHead[a] = pTemp->pNext;
                // move the tail
                if ( pSuperList->ppTail[a] == &pTemp->pNext )
                    pSuperList->ppTail[a] = ppTail;
                // skip the given cut in the list
                *ppTail = pTemp->pNext;
                // recycle pTemp
                Cut_CutRecycle( p, pTemp );
            }
            else
                ppTail = &pTemp->pNext;
        }
        assert( ppTail == pSuperList->ppTail[a] );
        assert( *ppTail == NULL );
    }

    return 0;
}